

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

UnitsMultipliers * __thiscall
libcellml::Analyser::AnalyserImpl::multiplyDivideUnitsMultipliers
          (UnitsMultipliers *__return_storage_ptr__,AnalyserImpl *this,double firstUnitsMultiplier,
          UnitsMultipliers *secondUnitsMultipliers,bool multiply)

{
  double *pdVar1;
  undefined3 in_register_00000009;
  const_iterator __end1;
  const_iterator __begin1;
  double *pdVar2;
  uint uVar3;
  double local_28;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (CONCAT31(in_register_00000009,multiply) == 0) {
    uVar3 = 0xbff00000;
  }
  else {
    uVar3 = 0x3ff00000;
  }
  pdVar1 = (secondUnitsMultipliers->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (secondUnitsMultipliers->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    local_28 = *pdVar2 * (double)((ulong)uVar3 << 0x20) + firstUnitsMultiplier;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

UnitsMultipliers Analyser::AnalyserImpl::multiplyDivideUnitsMultipliers(double firstUnitsMultiplier,
                                                                        const UnitsMultipliers &secondUnitsMultipliers,
                                                                        bool multiply)
{
    // Multiply/divide the given units multipliers together, following a
    // multiplication (multiply = true) or a division (multiply = false).

    UnitsMultipliers res;

    for (const auto &secondUnitsMultiplier : secondUnitsMultipliers) {
        res.push_back(multiplyDivideUnitsMultipliers(firstUnitsMultiplier,
                                                     secondUnitsMultiplier,
                                                     multiply));
    }

    return res;
}